

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

int execle(char *__path,char *__arg,...)

{
  char **__envp;
  long lVar1;
  char in_AL;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 *puVar5;
  uint uVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *plVar7;
  long *plVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  int i;
  ulong uVar9;
  long lVar10;
  undefined8 *puVar11;
  char **__argv;
  long lVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ulong local_120;
  char *local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  char *local_60;
  undefined1 *local_58;
  void *local_50;
  undefined8 local_48;
  va_list argv_itr;
  
  local_58 = (undefined1 *)local_118;
  local_60 = __path;
  argv_itr[0].overflow_arg_area = local_118;
  local_118[2] = (char *)in_RDX;
  local_118[3] = (char *)in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  plVar7 = (long *)&stack0x00000008;
  argv_itr[0]._0_8_ = plVar7;
  local_48 = 0x3000000010;
  uVar6 = 0x10;
  local_120 = 1;
  lVar12 = 1;
  do {
    if (uVar6 < 0x29) {
      uVar9 = (ulong)uVar6;
      uVar6 = uVar6 + 8;
      local_48 = CONCAT44(local_48._4_4_,uVar6);
      plVar8 = (long *)((long)argv_itr[0].overflow_arg_area + uVar9);
    }
    else {
      argv_itr[0]._0_8_ = plVar7 + 1;
      plVar8 = plVar7;
      plVar7 = plVar7 + 1;
    }
    lVar12 = lVar12 + 1;
  } while (*plVar8 != 0);
  uVar9 = lVar12 * 8 + 0xfU & 0xfffffffffffffff0;
  lVar1 = -uVar9;
  __argv = (char **)((long)local_118 + lVar1);
  argv_itr[0]._0_8_ = &stack0x00000008;
  local_48._0_4_ = 0x10;
  local_48._4_4_ = 0x30;
  *(undefined8 *)((long)local_118 + lVar1 + -8) = 0x103c0c;
  pcVar3 = strdup(__arg);
  *(char **)((long)local_118 - uVar9) = pcVar3;
  uVar6 = (uint)local_48;
  local_50 = argv_itr[0].overflow_arg_area;
  *(undefined8 *)((long)local_118 + lVar1 + -8) = 1;
  uVar9 = *(ulong *)((long)local_118 + lVar1 + -8);
  puVar11 = (undefined8 *)argv_itr[0]._0_8_;
  while( true ) {
    if (uVar6 < 0x29) {
      uVar4 = (ulong)uVar6;
      uVar6 = uVar6 + 8;
      puVar5 = (undefined8 *)(uVar4 + (long)local_50);
      local_48._0_4_ = uVar6;
    }
    else {
      argv_itr[0]._0_8_ = puVar11 + 1;
      puVar5 = puVar11;
      puVar11 = (undefined8 *)argv_itr[0]._0_8_;
    }
    pcVar3 = (char *)*puVar5;
    if (pcVar3 == (char *)0x0) break;
    *(undefined8 *)((long)local_118 + lVar1 + -8) = 0x103c4e;
    pcVar3 = strdup(pcVar3);
    __argv[uVar9] = pcVar3;
    uVar9 = uVar9 + 1;
  }
  __argv[uVar9 & 0xffffffff] = (char *)0x0;
  pcVar3 = local_60;
  if (uVar6 < 0x29) {
    puVar11 = (undefined8 *)((long)local_50 + (ulong)uVar6);
    local_48._0_4_ = uVar6 + 8;
  }
  else {
    argv_itr[0]._0_8_ = puVar11 + 1;
  }
  __envp = (char **)*puVar11;
  *(undefined8 *)((long)local_118 + lVar1 + -8) = 0x103c90;
  iVar2 = execve(pcVar3,__argv,__envp);
  for (lVar10 = 0; lVar12 != lVar10; lVar10 = lVar10 + 1) {
    pcVar3 = __argv[lVar10];
    *(undefined8 *)((long)local_118 + lVar1 + -8) = 0x103ca3;
    free(pcVar3);
  }
  return iVar2;
}

Assistant:

int execle(const char *path, const char *args, ...) {
    va_list argv_itr;

    size_t argc = 2; // reserve one for the path and one for NULL termination

    // count args received
    va_start(argv_itr, args);
    const char *arg_value = NULL;
    while ((arg_value = va_arg(argv_itr, const char *)) != NULL)
        argc++;
    va_end(argv_itr);

    // fill argv
    char *argv[argc];
    va_start(argv_itr, args);

    argv[0] = strdup(args);
    int offset = 1;
    while ((arg_value = va_arg(argv_itr, const char *)) != NULL) {
        argv[offset] = strdup(arg_value);
        offset++;
    }

    argv[offset] = NULL;
    char **envp = va_arg(argv_itr, char **);
    va_end(argv_itr);

    int res = execve(path, argv, envp);

    // free allocated strings
    for (int i = 0; i < argc; i++)
        free(argv[i]);

    return res;
}